

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

void __thiscall
Assimp::PLYImporter::InternReadFile
          (PLYImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  aiMesh *paVar1;
  char *pcVar2;
  bool bVar3;
  uint i;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  DeadlyImportError *pDVar6;
  aiMaterial **ppaVar7;
  ulong uVar8;
  aiMesh **ppaVar9;
  aiNode *this_00;
  uint *puVar10;
  int __oflag;
  ulong uVar11;
  string defaultTexture;
  char *szMe;
  IOStreamBuffer<char> streamedBuffer;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> avMaterials;
  DOM sPlyDom;
  vector<char,_std::allocator<char>_> headerCheck;
  vector<char,_std::allocator<char>_> mBuffer2;
  string mode;
  long *__file;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mode,"rb",(allocator<char> *)&streamedBuffer);
  iVar4 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,mode._M_dataplus._M_p);
  __file = (long *)CONCAT44(extraout_var,iVar4);
  if (__file == (long *)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sPlyDom,
                   "Failed to open file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &streamedBuffer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sPlyDom,"."
                  );
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&streamedBuffer);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar5 = (**(code **)(*__file + 0x30))(__file);
  if (lVar5 == 0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sPlyDom,
                   "File ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &streamedBuffer,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sPlyDom,
                   " is empty.");
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&streamedBuffer);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  IOStreamBuffer<char>::IOStreamBuffer(&streamedBuffer,0x100000);
  IOStreamBuffer<char>::open(&streamedBuffer,(char *)__file,__oflag);
  headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IOStreamBuffer<char>::getNextLine(&streamedBuffer,&headerCheck);
  if (((((ulong)((long)headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start) < 3) ||
       ((byte)(*headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start | 0x20U) != 0x70)) ||
      ((byte)(headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[1] | 0x20U) != 0x6c)) ||
     ((byte)(headerCheck.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[2] | 0x20U) != 0x79)) {
    if (streamedBuffer.m_stream != (IOStream *)0x0) {
      streamedBuffer.m_stream = (IOStream *)0x0;
      streamedBuffer.m_filesize = 0;
      streamedBuffer.m_numBlocks = 0;
      streamedBuffer.m_blockIdx = 0;
      streamedBuffer.m_cachePos = 0;
      streamedBuffer.m_filePos = 0;
    }
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sPlyDom,"Invalid .ply file: Magic number \'ply\' is no there",
               (allocator<char> *)&defaultTexture);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&sPlyDom);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IOStreamBuffer<char>::getNextLine(&streamedBuffer,&mBuffer2);
  this->mBuffer =
       (uchar *)mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  szMe = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
  SkipSpacesAndLineEnd<char>
            (mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&szMe);
  sPlyDom.alElementData.
  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sPlyDom.alElementData.
  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sPlyDom.alElements.super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sPlyDom.alElementData.
  super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sPlyDom.alElements.super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sPlyDom.alElements.super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->pcDOM = &sPlyDom;
  bVar3 = TokenMatch<char>(&szMe,"format",6);
  if (!bVar3) {
    this->mBuffer = (uchar *)0x0;
    paVar1 = this->mGeneratedMesh;
    if (paVar1 != (aiMesh *)0x0) {
      aiMesh::~aiMesh(paVar1);
      operator_delete(paVar1,0x520);
      this->mGeneratedMesh = (aiMesh *)0x0;
    }
    if (streamedBuffer.m_stream != (IOStream *)0x0) {
      streamedBuffer.m_stream = (IOStream *)0x0;
      streamedBuffer.m_filesize = 0;
      streamedBuffer.m_numBlocks = 0;
      streamedBuffer.m_blockIdx = 0;
      streamedBuffer.m_cachePos = 0;
      streamedBuffer.m_filePos = 0;
    }
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&defaultTexture,"Invalid .ply file: Missing format specification",
               (allocator<char> *)&avMaterials);
    DeadlyImportError::DeadlyImportError(pDVar6,&defaultTexture);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = TokenMatch<char>(&szMe,"ascii",5);
  pcVar2 = szMe;
  if (bVar3) {
    SkipLine<char>(szMe,&szMe);
    bVar3 = PLY::DOM::ParseInstance(&streamedBuffer,&sPlyDom,this);
    if (!bVar3) {
      paVar1 = this->mGeneratedMesh;
      if (paVar1 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar1);
        operator_delete(paVar1,0x520);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (streamedBuffer.m_stream != (IOStream *)0x0) {
        streamedBuffer.m_stream = (IOStream *)0x0;
        streamedBuffer.m_filesize = 0;
        streamedBuffer.m_numBlocks = 0;
        streamedBuffer.m_blockIdx = 0;
        streamedBuffer.m_cachePos = 0;
        streamedBuffer.m_filePos = 0;
      }
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&defaultTexture,"Invalid .ply file: Unable to build DOM (#1)",
                 (allocator<char> *)&avMaterials);
      DeadlyImportError::DeadlyImportError(pDVar6,&defaultTexture);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar4 = strncmp(szMe,"binary_",7);
    if (iVar4 != 0) {
      paVar1 = this->mGeneratedMesh;
      if (paVar1 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar1);
        operator_delete(paVar1,0x520);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (streamedBuffer.m_stream != (IOStream *)0x0) {
        streamedBuffer.m_stream = (IOStream *)0x0;
        streamedBuffer.m_filesize = 0;
        streamedBuffer.m_numBlocks = 0;
        streamedBuffer.m_blockIdx = 0;
        streamedBuffer.m_cachePos = 0;
        streamedBuffer.m_filePos = 0;
      }
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&defaultTexture,"Invalid .ply file: Unknown file format",
                 (allocator<char> *)&avMaterials);
      DeadlyImportError::DeadlyImportError(pDVar6,&defaultTexture);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    szMe = pcVar2 + 7;
    bVar3 = PLY::DOM::ParseInstanceBinary
                      (&streamedBuffer,&sPlyDom,this,(pcVar2[7] + 0xbeU & 0xdf) == 0);
    if (!bVar3) {
      paVar1 = this->mGeneratedMesh;
      if (paVar1 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(paVar1);
        operator_delete(paVar1,0x520);
        this->mGeneratedMesh = (aiMesh *)0x0;
      }
      if (streamedBuffer.m_stream != (IOStream *)0x0) {
        streamedBuffer.m_stream = (IOStream *)0x0;
        streamedBuffer.m_filesize = 0;
        streamedBuffer.m_numBlocks = 0;
        streamedBuffer.m_blockIdx = 0;
        streamedBuffer.m_cachePos = 0;
        streamedBuffer.m_filePos = 0;
      }
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&defaultTexture,"Invalid .ply file: Unable to build DOM (#2)",
                 (allocator<char> *)&avMaterials);
      DeadlyImportError::DeadlyImportError(pDVar6,&defaultTexture);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (streamedBuffer.m_stream != (IOStream *)0x0) {
    streamedBuffer.m_stream = (IOStream *)0x0;
    streamedBuffer.m_filesize = 0;
    streamedBuffer.m_numBlocks = 0;
    streamedBuffer.m_blockIdx = 0;
    streamedBuffer.m_cachePos = 0;
    streamedBuffer.m_filePos = 0;
  }
  paVar1 = this->mGeneratedMesh;
  if (paVar1 != (aiMesh *)0x0) {
    if (paVar1->mFaces == (aiFace *)0x0) {
      paVar1->mPrimitiveTypes = 1;
    }
    avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    defaultTexture._M_dataplus._M_p = (pointer)&defaultTexture.field_2;
    defaultTexture._M_string_length = 0;
    defaultTexture.field_2._M_local_buf[0] = '\0';
    LoadMaterial(this,&avMaterials,&defaultTexture,paVar1->mFaces == (aiFace *)0x0);
    uVar11 = (ulong)((long)avMaterials.
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)avMaterials.
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
    pScene->mNumMaterials = (uint)uVar11;
    ppaVar7 = (aiMaterial **)
              operator_new__((long)avMaterials.
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)avMaterials.
                                   super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
    pScene->mMaterials = ppaVar7;
    for (uVar8 = 0; uVar8 < (uVar11 & 0xffffffff); uVar8 = uVar8 + 1) {
      pScene->mMaterials[uVar8] =
           avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      uVar11 = (ulong)pScene->mNumMaterials;
    }
    pScene->mNumMeshes = 1;
    ppaVar9 = (aiMesh **)operator_new__(8);
    pScene->mMeshes = ppaVar9;
    *ppaVar9 = this->mGeneratedMesh;
    this->mGeneratedMesh = (aiMesh *)0x0;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar11 = (ulong)pScene->mNumMeshes;
    this_00->mNumMeshes = pScene->mNumMeshes;
    puVar10 = (uint *)operator_new__(uVar11 << 2);
    this_00->mMeshes = puVar10;
    for (uVar8 = 0; uVar8 < uVar11; uVar8 = uVar8 + 1) {
      this_00->mMeshes[uVar8] = (uint)uVar8;
      this_00 = pScene->mRootNode;
      uVar11 = (ulong)this_00->mNumMeshes;
    }
    std::__cxx11::string::~string((string *)&defaultTexture);
    std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
              (&avMaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
    PLY::DOM::~DOM(&sPlyDom);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&headerCheck.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&streamedBuffer.m_cache.super__Vector_base<char,_std::allocator<char>_>);
    (**(code **)(*__file + 8))(__file);
    std::__cxx11::string::~string((string *)&mode);
    return;
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defaultTexture,"Invalid .ply file: Unable to extract mesh data ",
             (allocator<char> *)&avMaterials);
  DeadlyImportError::DeadlyImportError(pDVar6,&defaultTexture);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PLYImporter::InternReadFile(const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream(pIOHandler->Open(pFile, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + pFile + ".");
    }

    // Get the file-size
    const size_t fileSize( fileStream->FileSize() );
    if ( 0 == fileSize ) {
        throw DeadlyImportError("File " + pFile + " is empty.");
    }

    IOStreamBuffer<char> streamedBuffer(1024 * 1024);
    streamedBuffer.open(fileStream.get());

    // the beginning of the file must be PLY - magic, magic
    std::vector<char> headerCheck;
    streamedBuffer.getNextLine(headerCheck);

    if ((headerCheck.size() < 3) ||
            (headerCheck[0] != 'P' && headerCheck[0] != 'p') ||
            (headerCheck[1] != 'L' && headerCheck[1] != 'l') ||
            (headerCheck[2] != 'Y' && headerCheck[2] != 'y') ) {
        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Magic number \'ply\' is no there");
    }

    std::vector<char> mBuffer2;
    streamedBuffer.getNextLine(mBuffer2);
    mBuffer = (unsigned char*)&mBuffer2[0];

    char* szMe = (char*)&this->mBuffer[0];
    SkipSpacesAndLineEnd(szMe, (const char**)&szMe);

    // determine the format of the file data and construct the aiMesh
    PLY::DOM sPlyDom;   
    this->pcDOM = &sPlyDom;

    if (TokenMatch(szMe, "format", 6)) {
        if (TokenMatch(szMe, "ascii", 5)) {
            SkipLine(szMe, (const char**)&szMe);
            if (!PLY::DOM::ParseInstance(streamedBuffer, &sPlyDom, this)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#1)");
            }
        } else if (!::strncmp(szMe, "binary_", 7)) {
            szMe += 7;
            const bool bIsBE(isBigEndian(szMe));

            // skip the line, parse the rest of the header and build the DOM
            if (!PLY::DOM::ParseInstanceBinary(streamedBuffer, &sPlyDom, this, bIsBE)) {
                if (mGeneratedMesh != nullptr) {
                    delete(mGeneratedMesh);
                    mGeneratedMesh = nullptr;
                }

                streamedBuffer.close();
                throw DeadlyImportError("Invalid .ply file: Unable to build DOM (#2)");
            }
        } else {
            if (mGeneratedMesh != nullptr) {
                delete(mGeneratedMesh);
                mGeneratedMesh = nullptr;
            }

            streamedBuffer.close();
            throw DeadlyImportError("Invalid .ply file: Unknown file format");
        }
    } else {
        AI_DEBUG_INVALIDATE_PTR(this->mBuffer);
        if (mGeneratedMesh != nullptr) {
            delete(mGeneratedMesh);
            mGeneratedMesh = nullptr;
        }

        streamedBuffer.close();
        throw DeadlyImportError("Invalid .ply file: Missing format specification");
    }

    //free the file buffer
    streamedBuffer.close();

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Unable to extract mesh data ");
    }

    // if no face list is existing we assume that the vertex
    // list is containing a list of points
    bool pointsOnly = mGeneratedMesh->mFaces == nullptr ? true : false;
    if (pointsOnly) {
      mGeneratedMesh->mPrimitiveTypes = aiPrimitiveType::aiPrimitiveType_POINT;
    }

    // now load a list of all materials
    std::vector<aiMaterial*> avMaterials;
    std::string defaultTexture;
    LoadMaterial(&avMaterials, defaultTexture, pointsOnly);

    // now generate the output scene object. Fill the material list
    pScene->mNumMaterials = (unsigned int)avMaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        pScene->mMaterials[i] = avMaterials[i];
    }

    // fill the mesh list
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    pScene->mMeshes[0] = mGeneratedMesh;
    mGeneratedMesh = nullptr;

    // generate a simple node structure
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mRootNode->mNumMeshes; ++i) {
        pScene->mRootNode->mMeshes[i] = i;
    }
}